

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

VkDeviceSize __thiscall VmaBlockVector::CalcMaxBlockSize(VmaBlockVector *this)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  bool bVar4;
  
  sVar3 = (this->m_Blocks).m_Count;
  uVar2 = 0;
  do {
    bVar4 = sVar3 == 0;
    sVar3 = sVar3 - 1;
    if (bVar4) {
      return uVar2;
    }
    uVar1 = (this->m_Blocks).m_pArray[sVar3]->m_pMetadata->m_Size;
    if (uVar2 <= uVar1) {
      uVar2 = uVar1;
    }
  } while (uVar2 < this->m_PreferredBlockSize);
  return uVar2;
}

Assistant:

size_t size() const { return m_Count; }